

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_CallArgumentTypeMismatchThrows_Test::
~SemanticAnalyserTest_CallArgumentTypeMismatchThrows_Test
          (SemanticAnalyserTest_CallArgumentTypeMismatchThrows_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_CallArgumentTypeMismatchThrows_Test
            ((SemanticAnalyserTest_CallArgumentTypeMismatchThrows_Test *)0x1e9058);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, CallArgumentTypeMismatchThrows)
{
  std::string source = R"SRC(
  fn callTwice(f: function): void
  {
    f();
    f();
  }

  fn main(): f32
  {
    callTwice(12);
    ret 0;
  }
  )SRC";
  throwTest(source);
}